

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iso_writer.cpp
# Opt level: O0

void __thiscall IsoWriter::checkLayerBreakPoint(IsoWriter *this,int maxExtentSize)

{
  int32_t iVar1;
  uint uVar2;
  void *__s;
  IsoWriter *__n;
  uint8_t *tmpBuffer;
  int size;
  int rest;
  int lbn;
  int maxExtentSize_local;
  IsoWriter *this_local;
  
  iVar1 = absoluteSectorNum(this);
  if ((iVar1 < this->m_layerBreakPoint) && (this->m_layerBreakPoint < iVar1 + maxExtentSize)) {
    uVar2 = (this->m_layerBreakPoint - iVar1) * 0x800;
    __n = this;
    __s = operator_new__((long)(int)uVar2);
    memset(__s,0,(long)(int)uVar2);
    File::write(&this->m_file,(int)__s,(void *)(ulong)uVar2,(size_t)__n);
    if (__s != (void *)0x0) {
      operator_delete__(__s);
    }
    this->m_lastWritedObjectID = -1;
  }
  return;
}

Assistant:

void IsoWriter::checkLayerBreakPoint(const int maxExtentSize)
{
    const int lbn = absoluteSectorNum();
    if (lbn < m_layerBreakPoint && lbn + maxExtentSize > m_layerBreakPoint)
    {
        const int rest = m_layerBreakPoint - lbn;
        const int size = rest * SECTOR_SIZE;
        const auto tmpBuffer = new uint8_t[size];
        memset(tmpBuffer, 0, size);
        m_file.write(tmpBuffer, size);
        delete[] tmpBuffer;
        m_lastWritedObjectID = -1;
    }
}